

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::OP_GetThisScoped
              (FrameDisplay *pScope,Var defaultInstance,ScriptContext *scriptContext)

{
  ushort uVar1;
  BOOL BVar2;
  void *aValue;
  RecyclableObject *propertyObject;
  uint index;
  Var local_38;
  Var value;
  
  uVar1 = pScope->length;
  if (uVar1 != 0) {
    index = 0;
    do {
      local_38 = (Var)0x0;
      aValue = FrameDisplay::GetItem(pScope,index);
      propertyObject = VarTo<Js::RecyclableObject>(aValue);
      BVar2 = GetProperty_Internal<false>
                        (propertyObject,propertyObject,false,0x2d5,&local_38,scriptContext,
                         (PropertyValueInfo *)0x0);
      if (BVar2 != 0) {
        return local_38;
      }
      index = index + 1;
    } while (uVar1 != index);
  }
  return defaultInstance;
}

Assistant:

Var JavascriptOperators::OP_GetThisScoped(FrameDisplay *pScope, Var defaultInstance, ScriptContext* scriptContext)
    {
        // NOTE: If changes are made to this logic be sure to update the debuggers as well
        int length = pScope->GetLength();

        for (int i = 0; i < length; i += 1)
        {
            Var value = nullptr;
            RecyclableObject *obj = VarTo<RecyclableObject>(pScope->GetItem(i));
            if (JavascriptOperators::GetProperty(obj, Js::PropertyIds::_this, &value, scriptContext))
            {
                return value;
            }
        }

        return defaultInstance;
    }